

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void BrotliInitZopfliNodes(ZopfliNode *array,size_t length)

{
  ZopfliNode *pZVar1;
  ulong local_30;
  size_t i;
  ZopfliNode stub;
  size_t length_local;
  ZopfliNode *array_local;
  
  for (local_30 = 0; local_30 < length; local_30 = local_30 + 1) {
    pZVar1 = array + local_30;
    pZVar1->length = 1;
    pZVar1->distance = 0;
    pZVar1->dcode_insert_length = 0;
    pZVar1->u = (anon_union_4_3_cc401a1e_for_u)0x7effc99e;
  }
  return;
}

Assistant:

void BrotliInitZopfliNodes(ZopfliNode* array, size_t length) {
  ZopfliNode stub;
  size_t i;
  stub.length = 1;
  stub.distance = 0;
  stub.dcode_insert_length = 0;
  stub.u.cost = kInfinity;
  for (i = 0; i < length; ++i) array[i] = stub;
}